

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall TCPTransmitter::TCPTransmitter(TCPTransmitter *this,string *ipaddr,int port)

{
  pointer pcVar1;
  string local_40;
  
  Socket::Socket(&this->super_Socket,TCP);
  pcVar1 = (ipaddr->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + ipaddr->_M_string_length);
  Socket::setRemoteSocket(&this->super_Socket,&local_40,port);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  Socket::connectToRemote(&this->super_Socket);
  return;
}

Assistant:

TCPTransmitter::TCPTransmitter(const std::string ipaddr, int port) : Socket(Socket::type::TCP) {
  setRemoteSocket(ipaddr, port);
  setNOSIGPIPE();
  connectToRemote();
}